

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_lpf1_init_preallocated(ma_lpf1_config *pConfig,void *pHeap,ma_lpf1 *pLPF)

{
  uint uVar1;
  ma_result mVar2;
  ulong __n;
  
  if (pLPF != (ma_lpf1 *)0x0) {
    pLPF->pR1 = (ma_biquad_coefficient *)0x0;
    pLPF->_pHeap = (void *)0x0;
    pLPF->format = ma_format_unknown;
    pLPF->channels = 0;
    *(undefined8 *)&pLPF->a = 0;
    *(undefined8 *)&pLPF->_ownsHeap = 0;
    if ((pConfig != (ma_lpf1_config *)0x0) && (uVar1 = pConfig->channels, (ulong)uVar1 != 0)) {
      pLPF->_pHeap = pHeap;
      if ((pHeap != (void *)0x0) && (__n = (ulong)uVar1 * 4 + 7 & 0xfffffffffffffff8, __n != 0)) {
        memset(pHeap,0,__n);
      }
      pLPF->pR1 = (ma_biquad_coefficient *)pHeap;
      mVar2 = ma_lpf1_reinit(pConfig,pLPF);
      return mVar2;
    }
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_lpf1_init_preallocated(const ma_lpf1_config* pConfig, void* pHeap, ma_lpf1* pLPF)
{
    ma_result result;
    ma_lpf1_heap_layout heapLayout;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    result = ma_lpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pLPF->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pLPF->pR1 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r1Offset);

    return ma_lpf1_reinit(pConfig, pLPF);
}